

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

int Abc_NodeFanin1Copy2(Abc_Obj_t *pObj)

{
  int iVar1;
  
  iVar1 = Abc_LitNotCond(*(int *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]] + 0x40)
                         ,*(uint *)&pObj->field_0x14 >> 0xb & 1);
  return iVar1;
}

Assistant:

static inline Abc_Obj_t * Abc_ObjFanin1( Abc_Obj_t * pObj )          { return (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[ pObj->vFanins.pArray[1] ];   }